

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBoxShape.h
# Opt level: O0

void __thiscall btBoxShape::getVertex(btBoxShape *this,int i,btVector3 *vtx)

{
  float fVar1;
  btScalar *pbVar2;
  uint uVar3;
  undefined8 *in_RDX;
  uint in_ESI;
  btVector3 halfExtents;
  float local_44;
  float local_40;
  float local_3c;
  btBoxShape *in_stack_ffffffffffffffc8;
  btScalar local_30 [2];
  btVector3 local_28;
  undefined8 *local_18;
  uint local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  local_28 = getHalfExtentsWithMargin(in_stack_ffffffffffffffc8);
  pbVar2 = btVector3::x(&local_28);
  fVar1 = *pbVar2;
  uVar3 = local_c & 1;
  pbVar2 = btVector3::x(&local_28);
  local_3c = fVar1 * (float)(int)(1 - uVar3) + -(*pbVar2 * (float)(local_c & 1));
  pbVar2 = btVector3::y(&local_28);
  fVar1 = *pbVar2;
  uVar3 = local_c & 2;
  pbVar2 = btVector3::y(&local_28);
  local_40 = fVar1 * (float)(1 - ((int)uVar3 >> 1)) + -(*pbVar2 * (float)((int)(local_c & 2) >> 1));
  pbVar2 = btVector3::z(&local_28);
  fVar1 = *pbVar2;
  uVar3 = local_c & 4;
  pbVar2 = btVector3::z(&local_28);
  local_44 = fVar1 * (float)(1 - ((int)uVar3 >> 2)) + -(*pbVar2 * (float)((int)(local_c & 4) >> 2));
  btVector3::btVector3((btVector3 *)&stack0xffffffffffffffc8,&local_3c,&local_40,&local_44);
  *local_18 = in_stack_ffffffffffffffc8;
  local_18[1] = local_30;
  return;
}

Assistant:

virtual void getVertex(int i,btVector3& vtx) const
	{
		btVector3 halfExtents = getHalfExtentsWithMargin();

		vtx = btVector3(
				halfExtents.x() * (1-(i&1)) - halfExtents.x() * (i&1),
				halfExtents.y() * (1-((i&2)>>1)) - halfExtents.y() * ((i&2)>>1),
				halfExtents.z() * (1-((i&4)>>2)) - halfExtents.z() * ((i&4)>>2));
	}